

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

QPushButton * __thiscall
QDialogButtonBox::addButton(QDialogButtonBox *this,QString *text,ButtonRole role)

{
  QDialogButtonBoxPrivate *this_00;
  QPushButton *this_01;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)role < 9) {
    this_00 = *(QDialogButtonBoxPrivate **)(this + 8);
    this_01 = (QPushButton *)operator_new(0x28);
    QPushButton::QPushButton(this_01,text,(QWidget *)this);
    QDialogButtonBoxPrivate::addButton(this_00,(QAbstractButton *)this_01,role,DoLayout,Connect);
  }
  else {
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    this_01 = (QPushButton *)0x0;
    QMessageLogger::warning
              (local_50,"QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QPushButton *QDialogButtonBox::addButton(const QString &text, ButtonRole role)
{
    Q_D(QDialogButtonBox);
    if (Q_UNLIKELY(role <= InvalidRole || role >= NRoles)) {
        qWarning("QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
        return nullptr;
    }
    QPushButton *button = new QPushButton(text, this);
    d->addButton(button, role);
    return button;
}